

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

void sqlite3VdbeMemShallowCopy(Mem *pTo,Mem *pFrom,int srcType)

{
  u16 uVar1;
  u8 uVar2;
  u8 uVar3;
  int srcType_local;
  Mem *pFrom_local;
  Mem *pTo_local;
  
  if ((pTo->flags & 0x9000) == 0) {
    pTo->u = pFrom->u;
    pTo->z = pFrom->z;
    uVar1 = pFrom->flags;
    uVar2 = pFrom->enc;
    uVar3 = pFrom->eSubtype;
    pTo->n = pFrom->n;
    pTo->flags = uVar1;
    pTo->enc = uVar2;
    pTo->eSubtype = uVar3;
    if ((pFrom->flags & 0x2000) == 0) {
      pTo->flags = pTo->flags & 0x8fff;
      pTo->flags = pTo->flags | (ushort)srcType;
    }
  }
  else {
    vdbeClrCopy(pTo,pFrom,srcType);
  }
  return;
}

Assistant:

SQLITE_PRIVATE void sqlite3VdbeMemShallowCopy(Mem *pTo, const Mem *pFrom, int srcType){
  assert( !sqlite3VdbeMemIsRowSet(pFrom) );
  assert( pTo->db==pFrom->db );
  if( VdbeMemDynamic(pTo) ){ vdbeClrCopy(pTo,pFrom,srcType); return; }
  memcpy(pTo, pFrom, MEMCELLSIZE);
  if( (pFrom->flags&MEM_Static)==0 ){
    pTo->flags &= ~(MEM_Dyn|MEM_Static|MEM_Ephem);
    assert( srcType==MEM_Ephem || srcType==MEM_Static );
    pTo->flags |= srcType;
  }
}